

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Lms_ManStop(Lms_Man_t *p)

{
  int *piVar1;
  void **ppvVar2;
  word *__ptr;
  char *__ptr_00;
  Vec_Mem_t *pVVar3;
  long lVar4;
  
  if (p->vLabels != (Vec_Int_t *)0x0) {
    piVar1 = p->vLabels->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vLabels->pArray = (int *)0x0;
    }
    if (p->vLabels != (Vec_Int_t *)0x0) {
      free(p->vLabels);
      p->vLabels = (Vec_Int_t *)0x0;
    }
  }
  if (p->vLabelsP != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vLabelsP->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vLabelsP->pArray = (void **)0x0;
    }
    if (p->vLabelsP != (Vec_Ptr_t *)0x0) {
      free(p->vLabelsP);
      p->vLabelsP = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vNodes != (Vec_Ptr_t *)0x0) {
    ppvVar2 = p->vNodes->pArray;
    if (ppvVar2 != (void **)0x0) {
      free(ppvVar2);
      p->vNodes->pArray = (void **)0x0;
    }
    if (p->vNodes != (Vec_Ptr_t *)0x0) {
      free(p->vNodes);
      p->vNodes = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vTruthPo != (Vec_Int_t *)0x0) {
    piVar1 = p->vTruthPo->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTruthPo->pArray = (int *)0x0;
    }
    if (p->vTruthPo != (Vec_Int_t *)0x0) {
      free(p->vTruthPo);
      p->vTruthPo = (Vec_Int_t *)0x0;
    }
  }
  if (p->vDelays != (Vec_Wrd_t *)0x0) {
    __ptr = p->vDelays->pArray;
    if (__ptr != (word *)0x0) {
      free(__ptr);
      p->vDelays->pArray = (word *)0x0;
    }
    if (p->vDelays != (Vec_Wrd_t *)0x0) {
      free(p->vDelays);
      p->vDelays = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vAreas != (Vec_Str_t *)0x0) {
    __ptr_00 = p->vAreas->pArray;
    if (__ptr_00 != (char *)0x0) {
      free(__ptr_00);
      p->vAreas->pArray = (char *)0x0;
    }
    if (p->vAreas != (Vec_Str_t *)0x0) {
      free(p->vAreas);
      p->vAreas = (Vec_Str_t *)0x0;
    }
  }
  if (p->vFreqs != (Vec_Int_t *)0x0) {
    piVar1 = p->vFreqs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vFreqs->pArray = (int *)0x0;
    }
    if (p->vFreqs != (Vec_Int_t *)0x0) {
      free(p->vFreqs);
      p->vFreqs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTruthFreqs != (Vec_Int_t *)0x0) {
    piVar1 = p->vTruthFreqs->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTruthFreqs->pArray = (int *)0x0;
    }
    if (p->vTruthFreqs != (Vec_Int_t *)0x0) {
      free(p->vTruthFreqs);
      p->vTruthFreqs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTruthIds != (Vec_Int_t *)0x0) {
    piVar1 = p->vTruthIds->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vTruthIds->pArray = (int *)0x0;
    }
    if (p->vTruthIds != (Vec_Int_t *)0x0) {
      free(p->vTruthIds);
      p->vTruthIds = (Vec_Int_t *)0x0;
    }
  }
  pVVar3 = p->vTtMem;
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    if (pVVar3->vTable != (Vec_Int_t *)0x0) {
      piVar1 = pVVar3->vTable->pArray;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        pVVar3->vTable->pArray = (int *)0x0;
      }
      if (pVVar3->vTable != (Vec_Int_t *)0x0) {
        free(pVVar3->vTable);
        pVVar3->vTable = (Vec_Int_t *)0x0;
      }
    }
    if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
      piVar1 = pVVar3->vNexts->pArray;
      if (piVar1 != (int *)0x0) {
        free(piVar1);
        pVVar3->vNexts->pArray = (int *)0x0;
      }
      if (pVVar3->vNexts != (Vec_Int_t *)0x0) {
        free(pVVar3->vNexts);
        pVVar3->vNexts = (Vec_Int_t *)0x0;
      }
    }
  }
  pVVar3 = p->vTtMem;
  if (-1 < pVVar3->iPage) {
    lVar4 = -1;
    do {
      if (pVVar3->ppPages[lVar4 + 1] != (word *)0x0) {
        free(pVVar3->ppPages[lVar4 + 1]);
        pVVar3->ppPages[lVar4 + 1] = (word *)0x0;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->iPage);
  }
  if (pVVar3->ppPages != (word **)0x0) {
    free(pVVar3->ppPages);
    pVVar3->ppPages = (word **)0x0;
  }
  if (pVVar3 != (Vec_Mem_t *)0x0) {
    free(pVVar3);
  }
  Gia_ManStopP(&p->pGia);
  if (p != (Lms_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Lms_ManStop( Lms_Man_t * p )
{
    // temporaries
    Vec_IntFreeP( &p->vLabels );
    Vec_PtrFreeP( &p->vLabelsP );
    Vec_PtrFreeP( &p->vNodes );
    // internal data for AIG level minimization
    Vec_IntFreeP( &p->vTruthPo );
    Vec_WrdFreeP( &p->vDelays );
    Vec_StrFreeP( &p->vAreas );
    Vec_IntFreeP( &p->vFreqs );
    Vec_IntFreeP( &p->vTruthFreqs );
    // internal data for library construction
    Vec_IntFreeP( &p->vTruthIds );
    Vec_MemHashFree( p->vTtMem );
//    Vec_MemHashFree( p->vTtMem2 );
    Vec_MemFree( p->vTtMem );
//    Vec_MemFree( p->vTtMem2 );
    Gia_ManStopP( &p->pGia );
    ABC_FREE( p );
}